

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::HierarchicalSoftmaxLoss::HierarchicalSoftmaxLoss
          (HierarchicalSoftmaxLoss *this,shared_ptr<fasttext::Matrix> *wo,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  size_type sVar1;
  vector<long,_std::allocator<long>_> *in_RDX;
  undefined8 *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_00000058;
  HierarchicalSoftmaxLoss *in_stack_00000060;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffffa8;
  BinaryLogisticLoss *in_stack_ffffffffffffffb0;
  
  BinaryLogisticLoss::BinaryLogisticLoss(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__HierarchicalSoftmaxLoss_001eea88;
  *(undefined1 (*) [16])(in_RDI + 8) = (undefined1  [16])0x0;
  in_RDI[10] = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1b012d);
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)0x1b0156);
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::vector((vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
            *)0x1b0182);
  sVar1 = std::vector<long,_std::allocator<long>_>::size(in_RDX);
  *(int *)(in_RDI + 0x11) = (int)sVar1;
  buildTree(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

HierarchicalSoftmaxLoss::HierarchicalSoftmaxLoss(
    std::shared_ptr<Matrix>& wo,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo),
      paths_(),
      codes_(),
      tree_(),
      osz_(targetCounts.size()) {
  buildTree(targetCounts);
}